

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevcd_fmt_conv.c
# Opt level: O2

void ihevcd_fmt_conv_420sp_to_rgba8888
               (UWORD8 *pu1_y_src,UWORD8 *pu1_uv_src,UWORD32 *pu4_rgba_dst,WORD32 wd,WORD32 ht,
               WORD32 src_y_strd,WORD32 src_uv_strd,WORD32 dst_strd,WORD32 is_u_first)

{
  byte bVar1;
  short sVar2;
  long lVar3;
  UWORD32 *pUVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  uint uVar13;
  uint uVar15;
  UWORD32 *pUVar16;
  int iVar17;
  UWORD32 *pUVar18;
  UWORD8 *local_88;
  UWORD8 *local_80;
  UWORD8 *local_78;
  UWORD8 *local_70;
  UWORD32 *local_68;
  uint uVar14;
  
  local_70 = pu1_uv_src + 1;
  local_78 = pu1_uv_src;
  if (is_u_first == 0) {
    local_70 = pu1_uv_src;
    local_78 = pu1_uv_src + 1;
  }
  local_80 = pu1_y_src + src_y_strd;
  lVar3 = (long)wd;
  lVar8 = src_y_strd * 2 - lVar3;
  uVar14 = 0;
  uVar13 = 0;
  pUVar16 = pu4_rgba_dst + dst_strd;
  local_88 = pu1_y_src;
  local_68 = pu4_rgba_dst;
  for (sVar2 = 0; (int)sVar2 < ht >> 1; sVar2 = sVar2 + 1) {
    pUVar18 = pUVar16 + (dst_strd * 2 - lVar3);
    pUVar4 = pUVar16 + (dst_strd - lVar3);
    lVar12 = 0;
    for (uVar11 = (uint)wd >> 1; 0 < (short)uVar11; uVar11 = uVar11 - 1) {
      uVar7 = (uint)local_88[lVar12];
      iVar9 = (int)((local_78[lVar12] - 0x80) * 0x20490) >> 0x10;
      uVar10 = iVar9 + uVar7;
      if ((int)(iVar9 + uVar7) < 1) {
        uVar10 = uVar13;
      }
      if (0xfe < (int)uVar10) {
        uVar10 = 0xff;
      }
      iVar5 = (int)(short)((local_70[lVar12] - 0x80) * 0x1fffe5f8 +
                           (local_78[lVar12] - 0x80) * 0x1ffff379 >> 0xd);
      iVar6 = iVar5 + uVar7;
      uVar15 = iVar6 * 0x100;
      if (iVar6 < 0) {
        uVar15 = uVar13;
      }
      if (0xff < iVar6) {
        uVar15 = 0xff00;
      }
      iVar17 = (int)((local_70[lVar12] - 0x80) * 0x19888) >> 0x10;
      iVar6 = uVar7 + iVar17;
      uVar7 = iVar6 * 0x10000;
      if (iVar6 < 0) {
        uVar7 = uVar13;
      }
      if (0xff < iVar6) {
        uVar7 = 0xff0000;
      }
      local_68[lVar12] = uVar7 | uVar10 | uVar15;
      uVar7 = (uint)local_88[lVar12 + 1];
      uVar10 = iVar9 + uVar7;
      if ((int)(iVar9 + uVar7) < 1) {
        uVar10 = uVar13;
      }
      if (0xfe < (int)uVar10) {
        uVar10 = 0xff;
      }
      iVar6 = iVar5 + uVar7;
      uVar15 = iVar6 * 0x100;
      if (iVar6 < 0) {
        uVar15 = uVar13;
      }
      if (0xff < iVar6) {
        uVar15 = 0xff00;
      }
      iVar6 = uVar7 + iVar17;
      uVar7 = iVar6 * 0x10000;
      if (iVar6 < 0) {
        uVar7 = uVar13;
      }
      if (0xff < iVar6) {
        uVar7 = 0xff0000;
      }
      local_68[lVar12 + 1] = uVar7 | uVar10 | uVar15;
      uVar7 = (uint)local_80[lVar12];
      uVar10 = iVar9 + uVar7;
      if ((int)(iVar9 + uVar7) < 1) {
        uVar10 = uVar13;
      }
      if (0xfe < (int)uVar10) {
        uVar10 = 0xff;
      }
      iVar6 = iVar5 + uVar7;
      uVar15 = iVar6 * 0x100;
      if (iVar6 < 0) {
        uVar15 = uVar14;
      }
      if (0xff < iVar6) {
        uVar15 = 0xff00;
      }
      iVar6 = uVar7 + iVar17;
      uVar7 = iVar6 * 0x10000;
      if (iVar6 < 0) {
        uVar7 = uVar14;
      }
      if (0xff < iVar6) {
        uVar7 = 0xff0000;
      }
      pUVar16[lVar12] = uVar7 | uVar10 | uVar15;
      bVar1 = local_80[lVar12 + 1];
      uVar10 = iVar9 + (uint)bVar1;
      if ((int)uVar10 < 1) {
        uVar10 = uVar14;
      }
      if (0xfe < (int)uVar10) {
        uVar10 = 0xff;
      }
      iVar5 = iVar5 + (uint)bVar1;
      uVar7 = iVar5 * 0x100;
      if (iVar5 < 0) {
        uVar7 = uVar14;
      }
      if (0xff < iVar5) {
        uVar7 = 0xff00;
      }
      iVar17 = iVar17 + (uint)bVar1;
      uVar15 = iVar17 * 0x10000;
      if (iVar17 < 0) {
        uVar15 = uVar14;
      }
      if (0xff < iVar17) {
        uVar15 = 0xff0000;
      }
      pUVar16[lVar12 + 1] = uVar15 | uVar10 | uVar7;
      lVar12 = lVar12 + 2;
      pUVar18 = pUVar18 + 2;
      pUVar4 = pUVar4 + 2;
    }
    local_78 = local_78 + lVar12 + (src_uv_strd - lVar3);
    local_70 = local_70 + lVar12 + (src_uv_strd - lVar3);
    local_88 = local_88 + lVar12 + lVar8;
    local_80 = local_80 + lVar12 + lVar8;
    pUVar16 = pUVar18;
    local_68 = pUVar4;
  }
  return;
}

Assistant:

void ihevcd_fmt_conv_420sp_to_rgba8888(UWORD8 *pu1_y_src,
                                       UWORD8 *pu1_uv_src,
                                       UWORD32 *pu4_rgba_dst,
                                       WORD32 wd,
                                       WORD32 ht,
                                       WORD32 src_y_strd,
                                       WORD32 src_uv_strd,
                                       WORD32 dst_strd,
                                       WORD32 is_u_first)
{


    WORD16  i2_r, i2_g, i2_b;
    UWORD32  u4_r, u4_g, u4_b;
    WORD16  i2_i, i2_j;
    UWORD8  *pu1_y_src_nxt;
    UWORD32 *pu4_rgba_dst_NextRow;

    UWORD8 *pu1_u_src, *pu1_v_src;

    if(is_u_first)
    {
        pu1_u_src = (UWORD8 *)pu1_uv_src;
        pu1_v_src = (UWORD8 *)pu1_uv_src + 1;
    }
    else
    {
        pu1_u_src = (UWORD8 *)pu1_uv_src + 1;
        pu1_v_src = (UWORD8 *)pu1_uv_src;
    }

    pu1_y_src_nxt   = pu1_y_src + src_y_strd;
    pu4_rgba_dst_NextRow = pu4_rgba_dst + dst_strd;

    for(i2_i = 0; i2_i < (ht >> 1); i2_i++)
    {
        for(i2_j = (wd >> 1); i2_j > 0; i2_j--)
        {
            i2_b = ((*pu1_u_src - 128) * COEFF4 >> 13);
            i2_g = ((*pu1_u_src - 128) * COEFF2 + (*pu1_v_src - 128) * COEFF3) >> 13;
            i2_r = ((*pu1_v_src - 128) * COEFF1) >> 13;

            pu1_u_src += 2;
            pu1_v_src += 2;
            /* pixel 0 */
            /* B */
            u4_b = CLIP_U8(*pu1_y_src + i2_b);
            /* G */
            u4_g = CLIP_U8(*pu1_y_src + i2_g);
            /* R */
            u4_r = CLIP_U8(*pu1_y_src + i2_r);

            pu1_y_src++;
            *pu4_rgba_dst++ = ((u4_r << 16) | (u4_g << 8) | (u4_b << 0));

            /* pixel 1 */
            /* B */
            u4_b = CLIP_U8(*pu1_y_src + i2_b);
            /* G */
            u4_g = CLIP_U8(*pu1_y_src + i2_g);
            /* R */
            u4_r = CLIP_U8(*pu1_y_src + i2_r);

            pu1_y_src++;
            *pu4_rgba_dst++ = ((u4_r << 16) | (u4_g << 8) | (u4_b << 0));

            /* pixel 2 */
            /* B */
            u4_b = CLIP_U8(*pu1_y_src_nxt + i2_b);
            /* G */
            u4_g = CLIP_U8(*pu1_y_src_nxt + i2_g);
            /* R */
            u4_r = CLIP_U8(*pu1_y_src_nxt + i2_r);

            pu1_y_src_nxt++;
            *pu4_rgba_dst_NextRow++ = ((u4_r << 16) | (u4_g << 8) | (u4_b << 0));

            /* pixel 3 */
            /* B */
            u4_b = CLIP_U8(*pu1_y_src_nxt + i2_b);
            /* G */
            u4_g = CLIP_U8(*pu1_y_src_nxt + i2_g);
            /* R */
            u4_r = CLIP_U8(*pu1_y_src_nxt + i2_r);

            pu1_y_src_nxt++;
            *pu4_rgba_dst_NextRow++ = ((u4_r << 16) | (u4_g << 8) | (u4_b << 0));

        }

        pu1_u_src = pu1_u_src + src_uv_strd - wd;
        pu1_v_src = pu1_v_src + src_uv_strd - wd;

        pu1_y_src = pu1_y_src + (src_y_strd << 1) - wd;
        pu1_y_src_nxt = pu1_y_src_nxt + (src_y_strd << 1) - wd;

        pu4_rgba_dst = pu4_rgba_dst_NextRow - wd + dst_strd;
        pu4_rgba_dst_NextRow = pu4_rgba_dst_NextRow + (dst_strd << 1) - wd;
    }


}